

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithmeticSubtermGeneralization.cpp
# Opt level: O2

Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> * __thiscall
Inferences::intersectSortedStack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>>>
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
           *__return_storage_ptr__,Inferences *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *l,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *r)

{
  bool bVar1;
  long lVar2;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this_00;
  uint uVar3;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *l_00;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  char *__file;
  
  lVar4 = *(long *)(this + 8);
  lVar2 = *(long *)(this + 0x10);
  this_00 = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)this;
  if ((lVar2 != lVar4) && (this_00 = l, l->_cursor != l->_stack)) {
    this_00 = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)this;
    if ((ulong)((long)l->_cursor - (long)l->_stack) < (ulong)(lVar2 - lVar4)) {
      this_00 = l;
    }
    __file = (char *)0x0;
    uVar6 = 0;
    uVar3 = 0;
    while( true ) {
      lVar2 = lVar2 - lVar4;
      if ((ulong)(lVar2 / 0x30) <= uVar6) break;
      uVar5 = (ulong)uVar3;
      lVar2 = (long)l->_cursor - (long)l->_stack;
      if ((ulong)(lVar2 / 0x30) <= uVar5) break;
      bVar1 = Kernel::operator==((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                                 (lVar4 + uVar6 * 0x30),l->_stack + uVar5);
      l_00 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             (uVar6 * 0x30 + *(long *)(this + 8));
      if (bVar1) {
        Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::operator=
                  (this_00->_stack + (long)__file,l_00);
        uVar6 = (ulong)((int)uVar6 + 1);
        uVar3 = uVar3 + 1;
        __file = (char *)(ulong)((int)__file + 1);
      }
      else {
        bVar1 = Kernel::operator<(l_00,l->_stack + uVar5);
        if (bVar1) {
          uVar6 = (ulong)((int)uVar6 + 1);
        }
        else {
          uVar3 = uVar3 + 1;
        }
      }
      lVar4 = *(long *)(this + 8);
      lVar2 = *(long *)(this + 0x10);
    }
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::truncate
              (this_00,__file,lVar2 % 0x30);
  }
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
            (__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

Stack<C> intersectSortedStack(Stack<C>&& l, Stack<C>&& r) 
{
  // DEBUG("lhs: ", l)
  // DEBUG("rhs: ", r)

  if (l.size() == 0) return std::move(l);
  if (r.size() == 0) return std::move(r);

  unsigned outOffs = 0;
  auto& out = l.size() <= r.size() ? l : r;
  unsigned loffs = 0;
  unsigned roffs = 0;
  while (loffs < l.size() && roffs < r.size()) {
    if (l[loffs] == r[roffs]) {
      out[outOffs++] = l[loffs];
      loffs++;
      roffs++;
    } else if(l[loffs] < r[roffs]) {
      loffs++;
    } else {
      roffs++;
    }
  }
  
  out.truncate(outOffs);
  //DEBUG("out: ", out);
  return std::move(out);
}